

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblyEnvironment::SetGlobalValue
          (WebAssemblyEnvironment *this,WasmGlobal *global,WasmConstLitNode cnst)

{
  code *pcVar1;
  bool bVar2;
  uint offset_00;
  WasmType WVar3;
  undefined4 *puVar4;
  WebAssemblyModule *this_00;
  uint32 offset;
  WasmGlobal *global_local;
  WebAssemblyEnvironment *this_local;
  WasmConstLitNode cnst_local;
  
  if (global == (WasmGlobal *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xae,"(global)","global");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
  offset_00 = WebAssemblyModule::GetOffsetForGlobal(this_00,global);
  WVar3 = Wasm::WasmGlobal::GetType(global);
  this_local._0_4_ = cnst.field_0.f32;
  switch(WVar3) {
  case FirstLocalType:
    SetGlobalInternal<int>(this,offset_00,(int)this_local._0_4_);
    break;
  case I64:
    SetGlobalInternal<long>(this,offset_00,(long)cnst.field_0.f64);
    break;
  case F32:
    SetGlobalInternal<float>(this,offset_00,this_local._0_4_);
    break;
  case F64:
    SetGlobalInternal<double>(this,offset_00,cnst.field_0.f64);
    break;
  case V128:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xb8,"((0))","Wasm.Simd globals not supported");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  default:
    Wasm::WasmTypes::
    CompileAssertCases<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
  }
  return;
}

Assistant:

void WebAssemblyEnvironment::SetGlobalValue(Wasm::WasmGlobal* global, Wasm::WasmConstLitNode cnst)
{
    AssertOrFailFast(global);
    uint32 offset = module->GetOffsetForGlobal(global);

    switch (global->GetType())
    {
    case Wasm::WasmTypes::I32: SetGlobalInternal<int>(offset, cnst.i32); break;
    case Wasm::WasmTypes::I64: SetGlobalInternal<int64>(offset, cnst.i64); break;
    case Wasm::WasmTypes::F32: SetGlobalInternal<float>(offset, cnst.f32); break;
    case Wasm::WasmTypes::F64: SetGlobalInternal<double>(offset, cnst.f64); break;
#ifdef ENABLE_WASM_SIMD
    case Wasm::WasmTypes::V128: AssertOrFailFastMsg(UNREACHED, "Wasm.Simd globals not supported");
#endif
    default:
        Wasm::WasmTypes::CompileAssertCases<Wasm::WasmTypes::I32, Wasm::WasmTypes::I64, Wasm::WasmTypes::F32, Wasm::WasmTypes::F64, WASM_V128_CHECK_TYPE>();
    }
}